

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int psbt_input_sign(wally_psbt_input *input,uchar *priv_key,size_t priv_key_len,uchar *pub_key,
                   size_t pub_key_len,uchar *bytes,size_t bytes_len,uint32_t flags)

{
  int iVar1;
  size_t value_len;
  uint local_ec;
  int ret;
  uint32_t sighash;
  size_t der_len;
  uchar der [73];
  uchar sig [64];
  uchar *bytes_local;
  size_t pub_key_len_local;
  uchar *pub_key_local;
  size_t priv_key_len_local;
  uchar *priv_key_local;
  wally_psbt_input *input_local;
  
  if ((input == (wally_psbt_input *)0x0) || (input->sighash == 0)) {
    local_ec = 1;
  }
  else {
    local_ec = input->sighash;
  }
  if (((((input == (wally_psbt_input *)0x0) || (priv_key == (uchar *)0x0)) || (priv_key_len != 0x20)
       ) || ((iVar1 = wally_ec_public_key_verify(pub_key,pub_key_len), iVar1 != 0 ||
             (bytes == (uchar *)0x0)))) ||
     ((bytes_len != 0x20 || (((flags & 0xfffffff0) != 0 || ((local_ec & 0xffffff00) != 0)))))) {
    input_local._4_4_ = -2;
  }
  else {
    input_local._4_4_ =
         wally_ec_sig_from_bytes(priv_key,0x20,bytes,0x20,flags & 4 | 1,der + 0x48,0x40);
    if ((input_local._4_4_ == 0) &&
       (input_local._4_4_ =
             wally_ec_sig_to_der(der + 0x48,0x40,(uchar *)&der_len,0x49,(size_t *)&ret),
       input_local._4_4_ == 0)) {
      value_len = _ret + 1;
      der[_ret - 8] = (uchar)local_ec;
      _ret = value_len;
      input_local._4_4_ =
           wally_psbt_input_add_signature(input,pub_key,pub_key_len,(uchar *)&der_len,value_len);
      wally_clear_2(der + 0x48,0x40,&der_len,0x49);
    }
  }
  return input_local._4_4_;
}

Assistant:

static int psbt_input_sign(struct wally_psbt_input *input,
                           const unsigned char *priv_key, size_t priv_key_len,
                           const unsigned char *pub_key, size_t pub_key_len,
                           const unsigned char *bytes, size_t bytes_len,
                           uint32_t flags)
{
    unsigned char sig[EC_SIGNATURE_LEN], der[EC_SIGNATURE_DER_MAX_LEN + 1];
    size_t der_len;
    uint32_t sighash = input && input->sighash ? input->sighash : WALLY_SIGHASH_ALL;
    int ret;

    if (!input || !priv_key || priv_key_len != EC_PRIVATE_KEY_LEN ||
        (wally_ec_public_key_verify(pub_key, pub_key_len) != WALLY_OK) ||
        !bytes || bytes_len != SHA256_LEN || (flags & ~EC_FLAGS_ALL) ||
        (sighash & 0xffffff00))
        return WALLY_EINVAL;

    /* Only grinding flag is relevant */
    flags = EC_FLAG_ECDSA | (flags & EC_FLAG_GRIND_R);
    if ((ret = wally_ec_sig_from_bytes(priv_key, priv_key_len,
                                       bytes, SHA256_LEN, flags,
                                       sig, sizeof(sig))) != WALLY_OK)
        return ret;

    if ((ret = wally_ec_sig_to_der(sig, sizeof(sig), der,
                                   sizeof(der), &der_len)) != WALLY_OK)
        return ret;

    /* Convert sig to DER, add sighash byte and store in the input */
    der[der_len++] = sighash & 0xff;
    ret = wally_psbt_input_add_signature(input, pub_key, pub_key_len,
                                         der, der_len);
    wally_clear_2(sig, sizeof(sig), der, sizeof(der));
    return ret;
}